

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O0

lword entry_address(GlobalVars *gv)

{
  int iVar1;
  ushort **ppuVar2;
  Symbol *pSVar3;
  LinkedSection *pLVar4;
  Section *in_RDI;
  lword entry;
  LinkedSection *ls;
  Symbol *sym;
  unsigned_long local_28 [2];
  Symbol *in_stack_ffffffffffffffe8;
  GlobalVars *in_stack_fffffffffffffff8;
  unsigned_long uVar5;
  
  if (in_RDI[1].offset != 0) {
    local_28[0] = 0;
    in_stack_ffffffffffffffe8 =
         findsymbol(in_stack_fffffffffffffff8,in_RDI,(char *)in_stack_ffffffffffffffe8);
    if (in_stack_ffffffffffffffe8 != (Symbol *)0x0) {
      return in_stack_ffffffffffffffe8->value;
    }
    ppuVar2 = __ctype_b_loc();
    if ((((*ppuVar2)[(int)(uint)*(byte *)in_RDI[1].offset] & 0x800) != 0) &&
       (iVar1 = __isoc99_sscanf(in_RDI[1].offset,"%lli",local_28), iVar1 == 1)) {
      return local_28[0];
    }
  }
  pSVar3 = findsymbol(in_stack_fffffffffffffff8,in_RDI,(char *)in_stack_ffffffffffffffe8);
  if (pSVar3 == (Symbol *)0x0) {
    pLVar4 = find_lnksec(gv,(char *)sym,ls._7_1_,ls._6_1_,ls._5_1_,ls._4_1_);
    if (pLVar4 == (LinkedSection *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = pLVar4->base;
    }
  }
  else {
    uVar5 = pSVar3->value;
  }
  return uVar5;
}

Assistant:

lword entry_address(struct GlobalVars *gv)
/* returns address of entry point for executables */
{
  struct Symbol *sym;
  struct LinkedSection *ls;

  if (gv->entry_name) {
    lword entry = 0;

    if (sym = findsymbol(gv,NULL,gv->entry_name)) {
      return (lword)sym->value;
    }
    else if (isdigit((unsigned char)*gv->entry_name)) {
      if (sscanf(gv->entry_name,"%lli",&entry) == 1)
        return entry;
    }
  }

  /* plan b: search for _start symbol: */
  if (sym = findsymbol(gv,NULL,"_start"))
      return (lword)sym->value;

  /* plan c: search for first executable section */
  if (ls = find_lnksec(gv,NULL,ST_CODE,SF_ALLOC,SF_ALLOC|SF_UNINITIALIZED,
                       SP_READ|SP_EXEC))
    return (lword)ls->base;

  return 0;
}